

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_cam_b3lyp.c
# Opt level: O3

void camb3_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double par;
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  dVar4 = get_ext_param(p,ext_params,2);
  par = get_ext_param(p,ext_params,3);
  pdVar1 = p->mix_coef;
  *pdVar1 = 1.0 - dVar3;
  pdVar1[1] = -dVar4;
  pdVar1[2] = 1.0 - dVar2;
  pdVar1[3] = dVar2;
  xc_func_set_ext_params_name(p->func_aux[1],"_omega",par);
  set_ext_params_cam(p,ext_params);
  return;
}

Assistant:

static void
camb3_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha, beta, omega, ac;

  assert(p != NULL);
  ac     = get_ext_param(p, ext_params, 0);
  alpha  = get_ext_param(p, ext_params, 1);
  beta   = get_ext_param(p, ext_params, 2);
  omega  = get_ext_param(p, ext_params, 3);

  p->mix_coef[0] = 1.0 - alpha;
  p->mix_coef[1] = -beta;
  p->mix_coef[2] = 1.0 - ac;
  p->mix_coef[3] = ac;

  xc_func_set_ext_params_name(p->func_aux[1], "_omega", omega);
  set_ext_params_cam(p, ext_params);
}